

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

int mpz_cmp_d(__mpz_struct *x,double d)

{
  int iVar1;
  double d_local;
  __mpz_struct *x_local;
  
  if (x->_mp_size < 0) {
    if (d < 0.0) {
      iVar1 = mpz_cmpabs_d(x,d);
      x_local._4_4_ = -iVar1;
    }
    else {
      x_local._4_4_ = -1;
    }
  }
  else if (0.0 <= d) {
    x_local._4_4_ = mpz_cmpabs_d(x,d);
  }
  else {
    x_local._4_4_ = 1;
  }
  return x_local._4_4_;
}

Assistant:

int
mpz_cmp_d (const mpz_t x, double d)
{
  if (x->_mp_size < 0)
    {
      if (d >= 0.0)
	return -1;
      else
	return -mpz_cmpabs_d (x, d);
    }
  else
    {
      if (d < 0.0)
	return 1;
      else
	return mpz_cmpabs_d (x, d);
    }
}